

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O0

IFF_CHUNKED * dumbfile_read_okt(DUMBFILE *f)

{
  int32 iVar1;
  int iVar2;
  DUMBFILE *f_00;
  IFF_CHUNK *pIVar3;
  void *pvVar4;
  DUMBFILE *in_RDI;
  IFF_CHUNK *chunk;
  long bytes_read;
  IFF_CHUNKED *mod;
  DUMBFILE *f_01;
  char *in_stack_fffffffffffffff8;
  
  f_00 = (DUMBFILE *)malloc(0x10);
  if (f_00 != (DUMBFILE *)0x0) {
    *(uint *)&f_00->dfs = 0;
    f_00->file = (IFF_CHUNK *)0x0;
    while (pIVar3 = (IFF_CHUNK *)
                    realloc((IFF_CHUNK *)f_00->file,(ulong)(*(uint *)&f_00->dfs + 1) * 0x18),
          pIVar3 != (IFF_CHUNK *)0x0) {
      f_00->file = pIVar3;
      f_01 = (DUMBFILE *)(pIVar3 + *(uint *)&f_00->dfs);
      iVar1 = dumbfile_mgetl(f_01);
      if (iVar1 < 0) {
LAB_009a5a37:
        if (*(uint *)&f_00->dfs == 0) {
          if ((IFF_CHUNK *)f_00->file != (IFF_CHUNK *)0x0) {
            free((IFF_CHUNK *)f_00->file);
          }
          free(f_00);
          return (IFF_CHUNKED *)0x0;
        }
        return (IFF_CHUNKED *)f_00;
      }
      *(int32 *)&f_01->dfs = iVar1;
      iVar1 = dumbfile_mgetl(f_01);
      *(int32 *)&f_01->pos = iVar1;
      iVar2 = dumbfile_error(in_RDI);
      if (iVar2 != 0) goto LAB_009a5a37;
      pvVar4 = malloc((ulong)(uint)f_01->pos);
      f_01->file = pvVar4;
      if (f_01->file == (void *)0x0) {
        free(f_00->file);
        free(f_00);
        return (IFF_CHUNKED *)0x0;
      }
      iVar1 = dumbfile_getnc(in_stack_fffffffffffffff8,(int32)((ulong)in_RDI >> 0x20),f_00);
      if ((long)iVar1 < (long)(ulong)(uint)f_01->pos) {
        if ((long)iVar1 < 1) {
          free(f_01->file);
        }
        else {
          *(int32 *)&f_01->pos = iVar1;
          *(uint *)&f_00->dfs = *(uint *)&f_00->dfs + 1;
        }
        goto LAB_009a5a37;
      }
      *(uint *)&f_00->dfs = *(uint *)&f_00->dfs + 1;
    }
    if ((IFF_CHUNK *)f_00->file != (IFF_CHUNK *)0x0) {
      free((IFF_CHUNK *)f_00->file);
    }
    free(f_00);
  }
  return (IFF_CHUNKED *)0x0;
}

Assistant:

static IFF_CHUNKED *dumbfile_read_okt(DUMBFILE *f)
{
	IFF_CHUNKED *mod = (IFF_CHUNKED *) malloc(sizeof(*mod));
	if (!mod) return NULL;

	mod->chunk_count = 0;
	mod->chunks = 0;

	for (;;)
	{
		long bytes_read;
		IFF_CHUNK * chunk = ( IFF_CHUNK * ) realloc( mod->chunks, ( mod->chunk_count + 1 ) * sizeof( IFF_CHUNK ) );
		if ( !chunk )
		{
			if ( mod->chunks ) free( mod->chunks );
			free( mod );
			return NULL;
		}
		mod->chunks = chunk;
		chunk += mod->chunk_count;

		bytes_read = dumbfile_mgetl( f );
		if ( bytes_read < 0 ) break;

		chunk->type = bytes_read;
		chunk->size = dumbfile_mgetl( f );

		if ( dumbfile_error( f ) ) break;

		chunk->data = (unsigned char *) malloc( chunk->size );
		if ( !chunk->data )
		{
			free( mod->chunks );
			free( mod );
			return NULL;
		}

		bytes_read = dumbfile_getnc( ( char * ) chunk->data, chunk->size, f );
		if ( bytes_read < (long)chunk->size )
		{
			if ( bytes_read <= 0 ) {
				free( chunk->data );
				break;
			} else {
				chunk->size = bytes_read;
				mod->chunk_count++;
				break;
			}
		}

		mod->chunk_count++;
	}

	if ( !mod->chunk_count ) {
		if ( mod->chunks ) free(mod->chunks);
		free(mod);
		mod = NULL;
	}

	return mod;
}